

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

int32 rw::getSizeSkin(void *object,int32 offset,int32 param_3)

{
  int iVar1;
  int iVar2;
  Skin *skin_00;
  int32 iVar3;
  int local_34;
  int32 size;
  Skin *skin;
  Geometry *geometry;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  if (*(long *)((long)object + 0x98) != 0) {
    if (**(int **)((long)object + 0x98) == 4) {
      iVar3 = ps2::getSizeNativeSkin(object,offset);
      return iVar3;
    }
    if (**(int **)((long)object + 0x98) == 0xb) {
      iVar3 = wdgl::getSizeNativeSkin(object,offset);
      return iVar3;
    }
    if (**(int **)((long)object + 0x98) == 5) {
      iVar3 = xbox::getSizeNativeSkin(object,offset);
      return iVar3;
    }
    if (**(int **)((long)object + 0x98) == 8) {
      return -1;
    }
    if (**(int **)((long)object + 0x98) == 9) {
      return -1;
    }
  }
  skin_00 = *(Skin **)((long)object + (long)offset);
  if (skin_00 == (Skin *)0x0) {
    object_local._4_4_ = -1;
  }
  else {
    iVar1 = *(int *)((long)object + 0x1c);
    iVar2 = skin_00->numBones;
    if (version < 0x34000) {
      local_34 = skin_00->numBones * 4;
    }
    else {
      local_34 = skin_00->numUsedBones;
      iVar3 = skinSplitDataSize(skin_00);
      local_34 = local_34 + iVar3;
    }
    local_34 = local_34 + iVar1 * 0x14 + 4 + iVar2 * 0x40;
    object_local._4_4_ = local_34;
  }
  return object_local._4_4_;
}

Assistant:

static int32
getSizeSkin(void *object, int32 offset, int32)
{
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::getSizeNativeSkin(object, offset);
		if(geometry->instData->platform == PLATFORM_D3D8)
			return -1;
		if(geometry->instData->platform == PLATFORM_D3D9)
			return -1;
		assert(0 && "unsupported native skin platform");
	}

	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	if(skin == nil)
		return -1;

	int32 size = 4 + geometry->numVertices*(16+4) +
	             skin->numBones*64;
	// not sure which version introduced the new format
	if(version < 0x34000)
		size += skin->numBones*4;
	else
		size += skin->numUsedBones + skinSplitDataSize(skin);
	return size;
}